

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRange.h
# Opt level: O0

bool __thiscall
cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>::
none_of<testRange(int,char**)::__2>
          (cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
           *this)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  reference_wrapper<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:33:3)>
  __pred;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  
  __first._M_current = *(int **)this;
  __last._M_current = *(int **)(this + 8);
  __pred = std::ref<testRange(int,char**)::__2>((anon_class_1_0_00000001 *)((long)&this_local + 7));
  bVar1 = std::
          none_of<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::reference_wrapper<testRange(int,char**)::__2>>
                    (__first,__last,__pred);
  return bVar1;
}

Assistant:

bool none_of(UnaryPredicate p) const
  {
    return std::none_of(this->Begin, this->End, std::ref(p));
  }